

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QRect __thiscall QDockAreaLayoutInfo::itemRect(QDockAreaLayoutInfo *this,int index,bool isGap)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  const_reference pQVar6;
  quintptr qVar7;
  quintptr qVar8;
  int *piVar9;
  byte in_DL;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QRect QVar10;
  int next;
  int prev;
  int size;
  int pos;
  QDockAreaLayoutItem *item;
  QSize s;
  QPoint p;
  QRect result;
  QDockAreaLayoutItem *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  Orientation in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 uVar11;
  QRect *in_stack_ffffffffffffff70;
  int local_78;
  int local_74;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_DL & 1;
  pQVar6 = QList<QDockAreaLayoutItem>::at
                     ((QList<QDockAreaLayoutItem> *)
                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      (qsizetype)in_stack_ffffffffffffff48);
  bVar3 = QDockAreaLayoutItem::skip
                    ((QDockAreaLayoutItem *)
                     CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  if (bVar3) {
    QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  }
  else if ((bVar2 == 0) || ((pQVar6->flags & 1) != 0)) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    if ((*(byte *)(in_RDI + 0xb) & 1) == 0) {
      local_74 = pQVar6->pos;
      local_78 = pQVar6->size;
      if (bVar2 != 0) {
        iVar4 = QDockAreaLayoutInfo::prev
                          ((QDockAreaLayoutInfo *)
                           CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                           in_stack_ffffffffffffff54);
        iVar5 = QDockAreaLayoutInfo::next
                          ((QDockAreaLayoutInfo *)
                           CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                           in_stack_ffffffffffffff54);
        if ((iVar4 != -1) &&
           (pQVar6 = QList<QDockAreaLayoutItem>::at
                               ((QList<QDockAreaLayoutItem> *)
                                CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                (qsizetype)in_stack_ffffffffffffff48), (pQVar6->flags & 1) == 0)) {
          local_74 = *(int *)*in_RDI + local_74;
          local_78 = local_78 - *(int *)*in_RDI;
        }
        if ((iVar5 != -1) &&
           (pQVar6 = QList<QDockAreaLayoutItem>::at
                               ((QList<QDockAreaLayoutItem> *)
                                CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                (qsizetype)in_stack_ffffffffffffff48), (pQVar6->flags & 1) == 0)) {
          local_78 = local_78 - *(int *)*in_RDI;
        }
      }
      QPoint::QPoint((QPoint *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      piVar9 = rpick(in_stack_ffffffffffffff54,(QPoint *)in_stack_ffffffffffffff48);
      *piVar9 = local_74;
      QRect::topLeft((QRect *)in_stack_ffffffffffffff48);
      iVar4 = perp(in_stack_ffffffffffffff54,(QPoint *)in_stack_ffffffffffffff48);
      piVar9 = rperp(in_stack_ffffffffffffff54,(QPoint *)in_stack_ffffffffffffff48);
      *piVar9 = iVar4;
      QSize::QSize((QSize *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      piVar9 = rpick(in_stack_ffffffffffffff54,(QSize *)in_stack_ffffffffffffff48);
      *piVar9 = local_78;
      uVar11 = *(undefined4 *)((long)in_RDI + 0x24);
      QRect::size((QRect *)CONCAT44(local_78,iVar4));
      iVar5 = perp(in_stack_ffffffffffffff54,(QSize *)in_stack_ffffffffffffff48);
      piVar9 = rperp(in_stack_ffffffffffffff54,(QSize *)in_stack_ffffffffffffff48);
      *piVar9 = iVar5;
      QRect::QRect(in_stack_ffffffffffffff70,(QPoint *)CONCAT44(iVar5,uVar11),
                   (QSize *)CONCAT44(local_78,iVar4));
      local_18 = local_58;
      local_10 = local_50;
    }
    else {
      if (bVar2 == 0) {
        qVar7 = tabId(in_stack_ffffffffffffff48);
        qVar8 = currentTabId((QDockAreaLayoutInfo *)
                             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        if (qVar7 != qVar8) goto LAB_0056f16b;
      }
      QVar10 = tabContentRect((QDockAreaLayoutInfo *)
                              CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      local_28 = QVar10._0_8_;
      local_18 = local_28;
      local_20 = QVar10._8_8_;
      local_10 = local_20;
    }
  }
  else {
    QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  }
LAB_0056f16b:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  QVar10.x2.m_i = (int)local_10;
  QVar10._0_8_ = local_18;
  QVar10.y2.m_i = (int)((ulong)local_10 >> 0x20);
  return QVar10;
}

Assistant:

QRect QDockAreaLayoutInfo::itemRect(int index, bool isGap) const
{
    const QDockAreaLayoutItem &item = item_list.at(index);

    if (item.skip())
        return QRect();

    if (isGap && !(item.flags & QDockAreaLayoutItem::GapItem))
        return QRect();

    QRect result;

#if QT_CONFIG(tabbar)
    if (tabbed) {
        if (isGap || tabId(item) == currentTabId())
            result = tabContentRect();
    } else
#endif
    {
        int pos = item.pos;
        int size = item.size;

        if (isGap) {
            int prev = this->prev(index);
            int next = this->next(index);
            if (prev != -1 && !(item_list.at(prev).flags & QDockAreaLayoutItem::GapItem)) {
                pos += *sep;
                size -= *sep;
            }
            if (next != -1 && !(item_list.at(next).flags & QDockAreaLayoutItem::GapItem))
                size -= *sep;
        }

        QPoint p;
        rpick(o, p) = pos;
        rperp(o, p) = perp(o, rect.topLeft());
        QSize s;
        rpick(o, s) = size;
        rperp(o, s) = perp(o, rect.size());
        result = QRect(p, s);
    }

    return result;
}